

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_free(REF_CELL ref_cell)

{
  if (ref_cell != (REF_CELL)0x0) {
    ref_adj_free(ref_cell->ref_adj);
    if (ref_cell->c2n != (REF_INT *)0x0) {
      free(ref_cell->c2n);
    }
    if (ref_cell->f2n != (REF_INT *)0x0) {
      free(ref_cell->f2n);
    }
    if (ref_cell->e2n != (REF_INT *)0x0) {
      free(ref_cell->e2n);
    }
    free(ref_cell);
    return 0;
  }
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_free(REF_CELL ref_cell) {
  if (NULL == (void *)ref_cell) return REF_NULL;
  ref_adj_free(ref_cell->ref_adj);
  ref_free(ref_cell->c2n);
  ref_free(ref_cell->f2n);
  ref_free(ref_cell->e2n);
  ref_free(ref_cell);
  return REF_SUCCESS;
}